

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O2

void __thiscall picosha2::hash256_one_by_one::finish(hash256_one_by_one *this)

{
  pointer __src;
  long lVar1;
  ulong __n;
  byte_t temp [64];
  uchar local_58 [56];
  byte_t local_20 [8];
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    local_58[lVar1] = '\0';
  }
  __src = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  __n = (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(local_58,__src,__n);
  }
  local_58[__n] = 0x80;
  if (__n < 0x38) {
    for (; __n != 0x3b; __n = __n + 1) {
      local_58[__n + 1] = '\0';
    }
  }
  else {
    for (; __n != 0x3f; __n = __n + 1) {
      local_58[__n + 1] = '\0';
    }
    detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,&stack0xffffffffffffffe8)
    ;
    for (lVar1 = 0; lVar1 != 0x3c; lVar1 = lVar1 + 1) {
      local_58[lVar1] = '\0';
    }
  }
  write_data_bit_length(this,local_58 + 0x38);
  detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,&stack0xffffffffffffffe8);
  return;
}

Assistant:

void finish() {
        byte_t temp[64];
        std::fill(temp, temp + 64, 0);
        std::size_t remains = buffer_.size();
        std::copy(buffer_.begin(), buffer_.end(), temp);
        temp[remains] = 0x80;

        if (remains > 55) {
            std::fill(temp + remains + 1, temp + 64, 0);
            detail::hash256_block(h_, temp, temp + 64);
            std::fill(temp, temp + 64 - 4, 0);
        } else {
            std::fill(temp + remains + 1, temp + 64 - 4, 0);
        }

        write_data_bit_length(&(temp[56]));
        detail::hash256_block(h_, temp, temp + 64);
    }